

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitileave.hpp
# Opt level: O2

uint64_t bitmanip::detail::ileaveZeros_shift<3u>(uint32_t input)

{
  int i;
  long lVar1;
  ulong uVar2;
  ulong local_28 [5];
  
  local_28[0] = 0x1111111111111111;
  local_28[1] = 0x303030303030303;
  local_28[2] = 0xf000f000f000f;
  local_28[3] = 0xff000000ff;
  local_28[4] = 0xffff;
  uVar2 = (ulong)input;
  for (lVar1 = 4; lVar1 != -1; lVar1 = lVar1 + -1) {
    uVar2 = (uVar2 << ((byte)(3 << ((byte)lVar1 & 0x1f)) & 0x3f) | uVar2) & local_28[lVar1];
  }
  return uVar2;
}

Assistant:

[[nodiscard]] constexpr std::uint64_t ileaveZeros_shift(std::uint32_t input) noexcept
{
    if constexpr (BITS == 0) {
        return input;
    }
    else {
        constexpr std::uint64_t MASKS[] = {
            detail::duplBits_naive(detail::ileaveZeros_naive(~std::uint32_t(0), BITS), 1),
            detail::duplBits_naive(detail::ileaveZeros_naive(~std::uint32_t(0), BITS), 2),
            detail::duplBits_naive(detail::ileaveZeros_naive(~std::uint32_t(0), BITS), 4),
            detail::duplBits_naive(detail::ileaveZeros_naive(~std::uint32_t(0), BITS), 8),
            detail::duplBits_naive(detail::ileaveZeros_naive(~std::uint32_t(0), BITS), 16),
        };
        // log2_floor(0) == 0 so this is always safe, even for 1 bit
        constexpr int start = 4 - static_cast<int>(bitmanip::log2floor(BITS >> 1));

        std::uint64_t n = input;
        for (int i = start; i != -1; --i) {
            unsigned shift = BITS * (1u << i);
            n |= n << shift;
            n &= MASKS[i];
        }

        return n;
    }
}